

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O3

uint32_t __thiscall cfd::Psbt::AddTxInData(Psbt *this,UtxoData *utxo,uint32_t sequence)

{
  uint32_t index;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  OutPoint outpoint;
  Script redeem_script;
  TxOut txout;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_138;
  OutPoint local_120;
  TxOutReference local_f8;
  Script local_a8;
  TxOut local_70;
  
  core::OutPoint::OutPoint(&local_120,&utxo->txid,utxo->vout);
  core::TxOut::TxOut(&local_70);
  local_138.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  core::Script::Script(&local_a8);
  ConvertFromUtxoData(utxo,(OutPoint *)0x0,&local_70,&local_138,&local_a8,false,(NetType *)0x0);
  index = AddTxIn(this,&local_120,sequence);
  core::TxOutReference::TxOutReference(&local_f8,&local_70);
  core::Psbt::SetTxInUtxo(&this->super_Psbt,index,&local_f8,&local_a8,&local_138);
  local_f8.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__AbstractTxOutReference_00723740;
  core::Script::~Script(&local_f8.super_AbstractTxOutReference.locking_script_);
  core::Script::~Script(&local_a8);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_138);
  local_70.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)&PTR__AbstractTxOut_0072e7f0;
  core::Script::~Script(&local_70.super_AbstractTxOut.locking_script_);
  local_120.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
  if (local_120.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return index;
}

Assistant:

uint32_t Psbt::AddTxInData(const UtxoData& utxo, uint32_t sequence) {
  OutPoint outpoint(utxo.txid, utxo.vout);
  TxOut txout;
  std::vector<KeyData> key_list;
  Script redeem_script;
  ConvertFromUtxoData(utxo, nullptr, &txout, &key_list, &redeem_script);

  uint32_t index = AddTxIn(outpoint, sequence);
  try {
    cfd::core::Psbt::SetTxInUtxo(
        index, TxOutReference(txout), redeem_script, key_list);
  } catch (const CfdException& except) {
    struct wally_psbt* psbt_pointer;
    psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
    wally_psbt_remove_input(psbt_pointer, index);
    base_tx_ = cfd::core::Psbt::RebuildTransaction(wally_psbt_pointer_);
    throw except;
  }
  return index;
}